

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openxr_program.cpp
# Opt level: O2

void __thiscall anon_unknown.dwarf_5b5eb::OpenXrProgram::InitializeSystem(OpenXrProgram *this)

{
  XrFormFactor XVar1;
  XrResult res;
  char *pcVar2;
  XrSystemGetInfo systemInfo;
  string sStack_d8;
  string local_b8;
  string local_98;
  string local_78;
  string local_58;
  undefined4 local_38;
  undefined4 uStack_34;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  ulong local_28;
  
  if (this->m_instance == (XrInstance)0x0) {
    std::__cxx11::string::string((string *)&local_58,"Check failed",(allocator *)&sStack_d8);
    Throw(&local_58,"m_instance != XR_NULL_HANDLE",
          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK-Source/src/tests/hello_xr/openxr_program.cpp:296"
         );
  }
  if (this->m_systemId == 0) {
    local_38 = 4;
    uStack_34 = 0;
    uStack_30 = 0;
    uStack_2c = 0;
    local_28 = (ulong)(((this->m_options).
                        super___shared_ptr<const_Options,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                      Parsed).FormFactor;
    res = xrGetSystem(this->m_instance,&local_38,&this->m_systemId);
    CheckXrResult(res,"xrGetSystem(m_instance, &systemInfo, &m_systemId)",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK-Source/src/tests/hello_xr/openxr_program.cpp:301"
                 );
    XVar1 = (((this->m_options).super___shared_ptr<const_Options,_(__gnu_cxx::_Lock_policy)2>._M_ptr
             )->Parsed).FormFactor;
    if (XVar1 == XR_FORM_FACTOR_HEAD_MOUNTED_DISPLAY) {
      pcVar2 = "XR_FORM_FACTOR_HEAD_MOUNTED_DISPLAY";
    }
    else if (XVar1 == XR_FORM_FACTOR_MAX_ENUM) {
      pcVar2 = "XR_FORM_FACTOR_MAX_ENUM";
    }
    else if (XVar1 == XR_FORM_FACTOR_HANDHELD_DISPLAY) {
      pcVar2 = "XR_FORM_FACTOR_HANDHELD_DISPLAY";
    }
    else {
      pcVar2 = "Unknown XrFormFactor";
    }
    Fmt_abi_cxx11_(&sStack_d8,"Using system %d for form factor %s",this->m_systemId,pcVar2);
    Log::Write(Verbose,&sStack_d8);
    std::__cxx11::string::~string((string *)&sStack_d8);
    if (this->m_instance != (XrInstance)0x0) {
      if (this->m_systemId != 0) {
        return;
      }
      std::__cxx11::string::string((string *)&local_b8,"Check failed",(allocator *)&sStack_d8);
      Throw(&local_b8,"m_systemId != XR_NULL_SYSTEM_ID",
            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK-Source/src/tests/hello_xr/openxr_program.cpp:306"
           );
    }
    std::__cxx11::string::string((string *)&local_98,"Check failed",(allocator *)&sStack_d8);
    Throw(&local_98,"m_instance != XR_NULL_HANDLE",
          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK-Source/src/tests/hello_xr/openxr_program.cpp:305"
         );
  }
  std::__cxx11::string::string((string *)&local_78,"Check failed",(allocator *)&sStack_d8);
  Throw(&local_78,"m_systemId == XR_NULL_SYSTEM_ID",
        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK-Source/src/tests/hello_xr/openxr_program.cpp:297"
       );
}

Assistant:

void InitializeSystem() override {
        CHECK(m_instance != XR_NULL_HANDLE);
        CHECK(m_systemId == XR_NULL_SYSTEM_ID);

        XrSystemGetInfo systemInfo{XR_TYPE_SYSTEM_GET_INFO};
        systemInfo.formFactor = m_options->Parsed.FormFactor;
        CHECK_XRCMD(xrGetSystem(m_instance, &systemInfo, &m_systemId));

        Log::Write(Log::Level::Verbose,
                   Fmt("Using system %d for form factor %s", m_systemId, to_string(m_options->Parsed.FormFactor)));
        CHECK(m_instance != XR_NULL_HANDLE);
        CHECK(m_systemId != XR_NULL_SYSTEM_ID);
    }